

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O2

int ndn_signature_value_tlv_decode(ndn_decoder_t *decoder,ndn_signature_t *signature)

{
  _Bool _Var1;
  uint in_EAX;
  int iVar2;
  undefined8 uStack_28;
  uint32_t probe;
  
  uStack_28 = (ulong)in_EAX;
  iVar2 = decoder_get_var(decoder,(uint32_t *)((long)&uStack_28 + 4));
  if (iVar2 == 0) {
    if (uStack_28._4_4_ == 0x17) {
      _Var1 = false;
    }
    else {
      if (uStack_28._4_4_ != 0x2e) {
        return -0xc;
      }
      _Var1 = true;
    }
    signature->is_interest = _Var1;
    decoder_get_var(decoder,(uint32_t *)((long)&uStack_28 + 4));
    if (0xffffffd6 < uStack_28._4_4_ - 0x49) {
      signature->sig_size = uStack_28._4_4_;
      iVar2 = decoder_get_raw_buffer_value(decoder,signature->sig_value,uStack_28._4_4_);
      return iVar2;
    }
    iVar2 = -0xd;
  }
  return iVar2;
}

Assistant:

int
ndn_signature_value_tlv_decode(ndn_decoder_t* decoder, ndn_signature_t* signature)
{
  int ret_val = -1;
  uint32_t probe = 0;
  ret_val = decoder_get_type(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  if (probe == TLV_SignatureValue) {
    signature->is_interest = false;
  }
  else if (probe == TLV_InterestSignatureValue) {
    signature->is_interest = true;
  }
  else {
    return NDN_WRONG_TLV_TYPE;
  }
  ret_val = decoder_get_length(decoder, &probe);
  if (probe > NDN_SEC_MAX_SIG_SIZE)
    return NDN_WRONG_TLV_LENGTH;
  if (probe < NDN_SEC_MIN_SIG_SIZE)
    return NDN_WRONG_TLV_LENGTH;
  signature->sig_size = probe;
  ret_val = decoder_get_raw_buffer_value(decoder, signature->sig_value, signature->sig_size);
  if (ret_val != NDN_SUCCESS) return ret_val;
  return 0;
}